

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  CppType CVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  LogFinisher local_59;
  LogMessage local_58;
  MessageLite *pMVar5;
  
  pEVar3 = FindOrNull(this,number);
  pMVar5 = default_value;
  if (pEVar3 != (Extension *)0x0) {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x274);
      pLVar4 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_59,pLVar4);
      LogMessage::~LogMessage(&local_58);
    }
    CVar1 = anon_unknown_26::cpp_type(pEVar3->type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x274);
      pLVar4 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar4);
      LogMessage::~LogMessage(&local_58);
    }
    pMVar5 = (pEVar3->field_0).message_value;
    if ((pEVar3->field_0xa & 0x10) != 0) {
      iVar2 = (*pMVar5->_vptr_MessageLite[3])(pMVar5,default_value,this->arena_);
      pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    }
  }
  return pMVar5;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(default_value, arena_);
    } else {
      return *extension->message_value;
    }
  }
}